

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  cpp_dec_float<50U,_int,_void> *pcVar5;
  long lVar6;
  int iVar7;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  int *piVar10;
  uint *puVar11;
  bool bVar12;
  undefined8 uVar13;
  type t;
  int local_16c;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  int *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  int *local_a0;
  pointer local_98;
  long local_90;
  int *local_88;
  int *local_80;
  long local_78;
  long local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar4 = (this->l).firstUpdate;
  local_78 = (long)iVar4;
  iVar7 = (this->l).firstUnused;
  lVar8 = (long)iVar7;
  local_16c = n;
  if (iVar4 < iVar7) {
    local_98 = (this->l).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = (this->l).idx;
    local_80 = (this->l).row;
    local_88 = (this->l).start;
    local_b0 = nonz;
    local_a8 = eps;
    do {
      iVar4 = local_80[lVar8 + -1];
      lVar6 = (long)iVar4;
      local_70 = lVar6 * 0x38;
      uVar13 = *(undefined8 *)(vec[lVar6].m_backend.data._M_elems + 8);
      local_168.data._M_elems[8] = (uint)uVar13;
      local_168.data._M_elems[9] = (uint)((ulong)uVar13 >> 0x20);
      uVar13 = *(undefined8 *)vec[lVar6].m_backend.data._M_elems;
      uVar1 = *(undefined8 *)(vec[lVar6].m_backend.data._M_elems + 2);
      puVar11 = vec[lVar6].m_backend.data._M_elems + 4;
      uVar2 = *(undefined8 *)puVar11;
      uVar3 = *(undefined8 *)(puVar11 + 2);
      local_168.data._M_elems[4] = (uint)uVar2;
      local_168.data._M_elems[5] = (uint)((ulong)uVar2 >> 0x20);
      local_168.data._M_elems[6] = (uint)uVar3;
      local_168.data._M_elems[7] = (uint)((ulong)uVar3 >> 0x20);
      local_168.data._M_elems[0] = (uint)uVar13;
      local_168.data._M_elems[1] = (uint)((ulong)uVar13 >> 0x20);
      local_168.data._M_elems[2] = (uint)uVar1;
      local_168.data._M_elems[3] = (uint)((ulong)uVar1 >> 0x20);
      local_168.exp = vec[lVar6].m_backend.exp;
      local_168.neg = vec[lVar6].m_backend.neg;
      local_168.fpclass = vec[lVar6].m_backend.fpclass;
      local_168.prec_elem = vec[lVar6].m_backend.prec_elem;
      local_e8.data._M_elems[9] = vec[lVar6].m_backend.data._M_elems[9];
      puVar11 = vec[lVar6].m_backend.data._M_elems + 1;
      local_e8.data._M_elems._4_8_ = *(undefined8 *)puVar11;
      local_e8.data._M_elems._12_8_ = *(undefined8 *)(puVar11 + 2);
      puVar11 = vec[lVar6].m_backend.data._M_elems + 5;
      local_e8.data._M_elems._20_8_ = *(undefined8 *)puVar11;
      local_e8.data._M_elems._28_8_ = *(undefined8 *)(puVar11 + 2);
      local_e8.data._M_elems[0] = local_168.data._M_elems[0];
      local_e8.neg = (bool)((local_168.data._M_elems[0] != 0 ||
                            local_168.fpclass != cpp_dec_float_finite) ^ local_168.neg);
      iVar7 = local_88[lVar8];
      local_e8.exp = local_168.exp;
      local_e8.fpclass = local_168.fpclass;
      local_e8.prec_elem = local_168.prec_elem;
      if (iVar4 < iVar7) {
        piVar10 = local_a0 + local_88[lVar8 + -1];
        pcVar9 = &local_98[local_88[lVar8 + -1]].m_backend;
        local_90 = lVar8;
        do {
          pcVar5 = &vec[*piVar10].m_backend;
          local_128.fpclass = cpp_dec_float_finite;
          local_128.prec_elem = 10;
          local_128.data._M_elems[0] = 0;
          local_128.data._M_elems[1] = 0;
          local_128.data._M_elems[2] = 0;
          local_128.data._M_elems[3] = 0;
          local_128.data._M_elems[4] = 0;
          local_128.data._M_elems[5] = 0;
          local_128.data._M_elems._24_5_ = 0;
          local_128.data._M_elems[7]._1_3_ = 0;
          local_128.data._M_elems._32_5_ = 0;
          local_128.data._M_elems[9]._1_3_ = 0;
          local_128.exp = 0;
          local_128.neg = false;
          v = pcVar5;
          if ((pcVar9 != &local_128) && (v = pcVar9, &local_128 != pcVar5)) {
            uVar13 = *(undefined8 *)((pcVar5->data)._M_elems + 8);
            local_128.data._M_elems._32_5_ = SUB85(uVar13,0);
            local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
            local_128.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar5->data)._M_elems;
            local_128.data._M_elems._16_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 4);
            uVar13 = *(undefined8 *)((pcVar5->data)._M_elems + 6);
            local_128.data._M_elems._24_5_ = SUB85(uVar13,0);
            local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
            local_128.exp = pcVar5->exp;
            local_128.neg = pcVar5->neg;
            local_128.fpclass = pcVar5->fpclass;
            local_128.prec_elem = pcVar5->prec_elem;
          }
          piVar10 = piVar10 + 1;
          pcVar9 = pcVar9 + 1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_128,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_e8,&local_128);
          iVar7 = iVar7 + -1;
          lVar8 = local_90;
        } while (iVar4 < iVar7);
      }
      puVar11 = (uint *)((long)(vec->m_backend).data._M_elems + local_70);
      if (local_168.fpclass == cpp_dec_float_NaN) {
LAB_002b47de:
        local_168.data._M_elems[9] = local_e8.data._M_elems[9];
        local_168.data._M_elems[5] = local_e8.data._M_elems[5];
        local_168.data._M_elems[6] = local_e8.data._M_elems[6];
        local_168.data._M_elems[7] = local_e8.data._M_elems[7];
        local_168.data._M_elems[8] = local_e8.data._M_elems[8];
        local_168.data._M_elems[1] = local_e8.data._M_elems[1];
        local_168.data._M_elems[2] = local_e8.data._M_elems[2];
        local_168.data._M_elems[3] = local_e8.data._M_elems[3];
        local_168.data._M_elems[4] = local_e8.data._M_elems[4];
        local_168.neg =
             (bool)((local_e8.fpclass != cpp_dec_float_finite || local_e8.data._M_elems[0] != 0) ^
                   local_e8.neg);
        local_168.data._M_elems[0] = local_e8.data._M_elems[0];
        local_168.exp = local_e8.exp;
        local_168.fpclass = local_e8.fpclass;
        local_168.prec_elem = local_e8.prec_elem;
        if (local_e8.fpclass == cpp_dec_float_NaN) {
          uVar13._4_4_ = local_e8.prec_elem;
          uVar13._0_4_ = cpp_dec_float_NaN;
LAB_002b4863:
          local_128.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_168.data._M_elems[9],local_168.data._M_elems[8]),0);
          local_128.data._M_elems[9]._1_3_ = (undefined3)(local_168.data._M_elems[9] >> 8);
          local_128.data._M_elems[1] = local_168.data._M_elems[1];
          local_128.data._M_elems[0] = local_168.data._M_elems[0];
          local_128.data._M_elems[3] = local_168.data._M_elems[3];
          local_128.data._M_elems[2] = local_168.data._M_elems[2];
          local_128.data._M_elems[5] = local_168.data._M_elems[5];
          local_128.data._M_elems[4] = local_168.data._M_elems[4];
          local_128.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_168.data._M_elems[7],local_168.data._M_elems[6]),0);
          local_128.data._M_elems[7]._1_3_ = (undefined3)(local_168.data._M_elems[7] >> 8);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_128,0,(type *)0x0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_168,&local_128);
          if (iVar4 != 0) {
            uVar13._4_4_ = local_168.prec_elem;
            uVar13._0_4_ = local_168.fpclass;
            local_e8.exp = local_168.exp;
            goto LAB_002b4863;
          }
          local_128.fpclass = cpp_dec_float_finite;
          local_128.prec_elem = 10;
          local_128.data._M_elems._0_16_ = ZEXT816(0);
          local_128.data._M_elems[4] = 0;
          local_128.data._M_elems[5] = 0;
          local_128.data._M_elems._24_5_ = 0;
          local_128.data._M_elems[7]._1_3_ = 0;
          local_128.data._M_elems._32_5_ = 0;
          local_128.data._M_elems[9]._1_3_ = 0;
          local_128.exp = 0;
          local_128.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_128,1e-100);
          local_e8.exp = local_128.exp;
          local_168.neg = local_128.neg;
          uVar13 = local_128._48_8_;
        }
        *(ulong *)(puVar11 + 8) =
             CONCAT35(local_128.data._M_elems[9]._1_3_,local_128.data._M_elems._32_5_);
        *(undefined8 *)(puVar11 + 4) = local_128.data._M_elems._16_8_;
        *(ulong *)(puVar11 + 6) =
             CONCAT35(local_128.data._M_elems[7]._1_3_,local_128.data._M_elems._24_5_);
        *(undefined8 *)puVar11 = local_128.data._M_elems._0_8_;
        *(undefined8 *)(puVar11 + 2) = local_128.data._M_elems._8_8_;
        puVar11[10] = local_e8.exp;
        *(bool *)(puVar11 + 0xb) = local_168.neg;
        puVar11[0xc] = (fpclass_type)uVar13;
        puVar11[0xd] = SUB84(uVar13,4);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_128,0,(type *)0x0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_168,&local_128);
        if (iVar7 != 0) goto LAB_002b47de;
        local_168.data._M_elems[9] = local_e8.data._M_elems[9];
        local_168.data._M_elems[5] = local_e8.data._M_elems[5];
        local_168.data._M_elems[6] = local_e8.data._M_elems[6];
        local_168.data._M_elems[7] = local_e8.data._M_elems[7];
        local_168.data._M_elems[8] = local_e8.data._M_elems[8];
        local_168.data._M_elems[1] = local_e8.data._M_elems[1];
        local_168.data._M_elems[2] = local_e8.data._M_elems[2];
        local_168.data._M_elems[3] = local_e8.data._M_elems[3];
        local_168.data._M_elems[4] = local_e8.data._M_elems[4];
        bVar12 = local_e8.fpclass != cpp_dec_float_finite || local_e8.data._M_elems[0] != 0;
        local_168.neg = (bool)(local_e8.neg ^ bVar12);
        local_168.data._M_elems[0] = local_e8.data._M_elems[0];
        local_168.exp = local_e8.exp;
        local_168.fpclass = local_e8.fpclass;
        local_168.prec_elem = local_e8.prec_elem;
        local_128.data._M_elems._32_5_ =
             SUB85(CONCAT44(local_e8.data._M_elems[9],local_168.data._M_elems[8]),0);
        local_128.data._M_elems[9]._1_3_ = (undefined3)(local_e8.data._M_elems[9] >> 8);
        local_128.data._M_elems[5] = local_168.data._M_elems[5];
        local_128.data._M_elems[4] = local_168.data._M_elems[4];
        local_128.data._M_elems._24_5_ =
             SUB85(CONCAT44(local_168.data._M_elems[7],local_168.data._M_elems[6]),0);
        local_128.data._M_elems[7]._1_3_ = local_e8.data._M_elems[7]._1_3_;
        local_128.data._M_elems[1] = local_e8.data._M_elems[1];
        local_128.data._M_elems[2] = local_e8.data._M_elems[2];
        local_128.data._M_elems[0] = local_e8.data._M_elems[0];
        local_128.data._M_elems[3] = local_168.data._M_elems[3];
        local_68.data._M_elems._0_8_ = *(undefined8 *)(local_a8->m_backend).data._M_elems;
        local_68.data._M_elems._8_8_ = *(undefined8 *)((local_a8->m_backend).data._M_elems + 2);
        local_68.data._M_elems._16_8_ = *(undefined8 *)((local_a8->m_backend).data._M_elems + 4);
        local_68.data._M_elems._24_8_ = *(undefined8 *)((local_a8->m_backend).data._M_elems + 6);
        local_68.data._M_elems._32_8_ = *(undefined8 *)((local_a8->m_backend).data._M_elems + 8);
        local_68.exp = (local_a8->m_backend).exp;
        local_68.neg = (local_a8->m_backend).neg;
        local_68.fpclass = (local_a8->m_backend).fpclass;
        local_68.prec_elem = (local_a8->m_backend).prec_elem;
        local_128.exp = local_e8.exp;
        local_128.prec_elem = local_e8.prec_elem;
        local_128.fpclass = local_e8.fpclass;
        local_128.neg = local_168.neg;
        if ((local_e8.neg != bVar12) &&
           (local_e8.data._M_elems[0] != 0 || local_e8.fpclass != cpp_dec_float_finite)) {
          local_128.neg = (bool)(local_168.neg ^ 1);
        }
        if ((local_68.fpclass != cpp_dec_float_NaN && local_e8.fpclass != cpp_dec_float_NaN) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_128,&local_68), 0 < iVar7)) {
          lVar6 = (long)local_16c;
          local_16c = local_16c + 1;
          local_b0[lVar6] = iVar4;
          *(ulong *)(puVar11 + 8) = CONCAT44(local_168.data._M_elems[9],local_168.data._M_elems[8]);
          *(ulong *)(puVar11 + 4) = CONCAT44(local_168.data._M_elems[5],local_168.data._M_elems[4]);
          *(ulong *)(puVar11 + 6) = CONCAT44(local_168.data._M_elems[7],local_168.data._M_elems[6]);
          *(ulong *)puVar11 = CONCAT44(local_168.data._M_elems[1],local_168.data._M_elems[0]);
          *(ulong *)(puVar11 + 2) = CONCAT44(local_168.data._M_elems[3],local_168.data._M_elems[2]);
          puVar11[10] = local_168.exp;
          *(bool *)(puVar11 + 0xb) = local_168.neg;
          *(ulong *)(puVar11 + 0xc) = CONCAT44(local_168.prec_elem,local_168.fpclass);
        }
      }
      lVar8 = lVar8 + -1;
    } while (local_78 < lVar8);
  }
  return local_16c;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}